

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::BeginFunctionBody(SharedValidator *this,Location *loc,Index func_index)

{
  pointer pLVar1;
  pointer pFVar2;
  pointer pTVar3;
  ulong uVar4;
  Index IVar5;
  Result RVar6;
  pointer pTVar7;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  this->expr_loc_ = loc;
  pLVar1 = (this->locals_).
           super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->locals_).
      super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar1) {
    (this->locals_).
    super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar1;
  }
  uVar4 = (ulong)func_index;
  pFVar2 = (this->funcs_).
           super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)(((long)(this->funcs_).
                             super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2) / 0x30)) {
    pTVar3 = *(pointer *)
              ((long)&pFVar2[uVar4].params.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl + 8);
    for (pTVar7 = *(pointer *)
                   &pFVar2[uVar4].params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                    ._M_impl; pTVar7 != pTVar3; pTVar7 = pTVar7 + 1) {
      pLVar1 = (this->locals_).
               super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      IVar5 = 1;
      if ((this->locals_).
          super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
          ._M_impl.super__Vector_impl_data._M_start != pLVar1) {
        IVar5 = pLVar1[-1].end + 1;
      }
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(IVar5,pTVar7->enum_);
      std::
      vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>::
      emplace_back<wabt::SharedValidator::LocalDecl>(&this->locals_,(LocalDecl *)&local_48);
    }
    RVar6 = TypeChecker::BeginFunction
                      (&this->typechecker_,
                       &(this->funcs_).
                        super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar4].results);
  }
  else {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar6 = TypeChecker::BeginFunction(&this->typechecker_,(TypeVector *)&local_48);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_48);
  }
  return (Result)RVar6.enum_;
}

Assistant:

Result SharedValidator::BeginFunctionBody(const Location& loc,
                                          Index func_index) {
  expr_loc_ = &loc;
  locals_.clear();
  if (func_index < funcs_.size()) {
    for (Type type : funcs_[func_index].params) {
      // TODO: Coalesce parameters of the same type?
      locals_.push_back(LocalDecl{type, GetLocalCount() + 1});
    }
    return typechecker_.BeginFunction(funcs_[func_index].results);
  } else {
    // Signature isn't available, use empty.
    return typechecker_.BeginFunction(TypeVector());
  }
}